

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sound.c
# Opt level: O0

void get_vol(ubyte iobyte)

{
  byte local_a;
  ubyte channel;
  ubyte iobyte_local;
  
  if ((iobyte & 0x60) == 0) {
    local_a = 3;
  }
  else if ((iobyte & 0x60) == 0x20) {
    local_a = 2;
  }
  else if ((iobyte & 0x60) == 0x40) {
    local_a = 1;
  }
  else {
    local_a = 0;
  }
  vol[local_a] = '\x0f' - (iobyte & 0xf);
  return;
}

Assistant:

void get_vol(ubyte iobyte) {    // used to extract volume data from a byte

    ubyte channel;

    switch (iobyte & 0x60) {            // select channel
        case 0x00:
            channel = 3;
            break;
        case 0x20:
            channel = 2;
            break;
        case 0x40:
            channel = 1;
            break;
        default:
            channel = 0; // Added to prevent compiler warning.  Check behaviour. 2016
    }

    vol[channel] = ((ubyte) 15) - (iobyte & ((ubyte) 0xF));   // update channel
}